

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O2

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeQuad>::Read
          (TPZCompElHDiv<pzshape::TPZShapeQuad> *this,TPZStream *buf,void *context)

{
  int iVar1;
  long **pplVar2;
  ostream *poVar3;
  int iVar4;
  int classid;
  int sz;
  char *local_230 [4];
  TPZManVector<int,_4> SideOrient;
  TPZManVector<int,_3> order;
  TPZOneShapeRestraint one;
  
  TPZInterpolatedElement::Read((TPZInterpolatedElement *)this,buf,context);
  pplVar2 = TPZVec<long>::begin(&(this->fConnectIndexes).super_TPZVec<long>);
  (*buf->_vptr_TPZStream[0x1f])(buf,*pplVar2,9);
  TPZManVector<int,_3>::TPZManVector(&order,0);
  TPZStream::Read<int>(buf,&order.super_TPZVec<int>);
  TPZIntQuad::SetOrder
            (&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).fIntRule,&order.super_TPZVec<int>,0);
  TPZManVector<int,_4>::TPZManVector(&SideOrient,0);
  TPZStream::Read<int>(buf,&SideOrient.super_TPZVec<int>);
  TPZManVector<int,_4>::operator=(&this->fSideOrient,&SideOrient);
  pplVar2 = TPZVec<long>::begin(&(this->fConnectIndexes).super_TPZVec<long>);
  (*buf->_vptr_TPZStream[0x1f])(buf,*pplVar2,9);
  (*buf->_vptr_TPZStream[0x1d])
            (buf,&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).super_TPZInterpolatedElement.
                  super_TPZInterpolationSpace.fPreferredOrder,1);
  TPZStream::Read<int>(buf,&(this->fSideOrient).super_TPZVec<int>);
  (*buf->_vptr_TPZStream[0x1d])(buf,&sz,1);
  for (iVar4 = 0; iVar4 < sz; iVar4 = iVar4 + 1) {
    TPZOneShapeRestraint::TPZOneShapeRestraint(&one);
    TPZOneShapeRestraint::Read(&one,buf);
    std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::push_back
              (&this->fRestraints,&one);
    TPZOneShapeRestraint::~TPZOneShapeRestraint(&one);
  }
  classid = -1;
  (*buf->_vptr_TPZStream[0x1d])(buf,&classid,1);
  iVar4 = classid;
  iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x20))(this);
  if (iVar4 != iVar1) {
    std::__cxx11::stringstream::stringstream((stringstream *)&one);
    poVar3 = std::operator<<((ostream *)&one.fFaces.super_TPZVec<std::pair<long,_int>_>.fNElements,
                             "ERROR - ");
    poVar3 = std::operator<<(poVar3,
                             "virtual void TPZCompElHDiv<pzshape::TPZShapeQuad>::Read(TPZStream &, void *) [TSHAPE = pzshape::TPZShapeQuad]"
                            );
    poVar3 = std::operator<<(poVar3," trying to restore an object id ");
    iVar4 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x20))(this);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar4);
    poVar3 = std::operator<<(poVar3," and classid read = ");
    std::ostream::operator<<(poVar3,classid);
    std::__cxx11::stringbuf::str();
    poVar3 = std::operator<<((ostream *)&std::cout,local_230[0]);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)local_230);
    std::__cxx11::stringstream::~stringstream((stringstream *)&one);
  }
  TPZManVector<int,_4>::~TPZManVector(&SideOrient);
  TPZManVector<int,_3>::~TPZManVector(&order);
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::Read(TPZStream &buf, void *context)
{
	TPZInterpolatedElement::Read(buf,context);
  buf.Read(fConnectIndexes.begin(),TSHAPE::NSides);
	TPZManVector<int,3> order;
	buf.Read(order);
	this-> fIntRule.SetOrder(order);
    TPZManVector<int, TSHAPE::NFacets> SideOrient;
    buf.Read(SideOrient);
    fSideOrient = SideOrient;
	buf.Read(this->fConnectIndexes.begin(),TSHAPE::NSides);
	buf.Read(&this->fPreferredOrder,1);
    buf.Read(fSideOrient);
    int sz;
    buf.Read(&sz);
    for (int i=0; i<sz; i++) {
        TPZOneShapeRestraint one;
        one.Read(buf);
        fRestraints.push_back(one);
    }
	int classid = -1;
	buf.Read( &classid, 1 );
	if ( classid != this->ClassId())
	{
		std::stringstream sout;
		sout << "ERROR - " << __PRETTY_FUNCTION__
        << " trying to restore an object id " << this->ClassId() << " and classid read = " << classid;
		LOGPZ_ERROR ( logger, sout.str().c_str() );
	}
}